

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DAG.h
# Opt level: O3

void __thiscall DAGNode::DAGNode(DAGNode *this,int label,string *op,int left,int right)

{
  pointer pcVar1;
  
  this->label = label;
  (this->op)._M_dataplus._M_p = (pointer)&(this->op).field_2;
  pcVar1 = (op->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->op,pcVar1,pcVar1 + op->_M_string_length);
  (this->mainMark)._M_dataplus._M_p = (pointer)&(this->mainMark).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->mainMark,"");
  (this->addMarks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->addMarks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->addMarks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->left = left;
  this->right = right;
  this->isDeleted = false;
  return;
}

Assistant:

DAGNode(int label, string op, int left, int right): label(label), mainMark(""), op(op), left(left),
                                                    right(right), addMarks(), isDeleted(false){}